

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  string filename;
  string module_name;
  Printer printer;
  FileDescriptorProto fdp;
  long *local_1c0 [2];
  long local_1b0 [2];
  string local_1a0;
  LogFinisher local_180 [65];
  byte local_13f;
  LogMessage local_138 [56];
  FileDescriptorProto local_100 [208];
  ZeroCopyOutputStream *pZVar3;
  
  google::protobuf::internal::Mutex::Lock();
  this->file_ = file;
  anon_unknown_0::ModuleName(&local_1a0,*(string **)file);
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  google::protobuf::StripString((string *)local_1c0,".",'/');
  std::__cxx11::string::append((char *)local_1c0);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(local_100);
  google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)this->file_);
  google::protobuf::MessageLite::SerializeToString((string *)local_100);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_1c0);
  pZVar3 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  if (pZVar3 == (ZeroCopyOutputStream *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x10f);
    pLVar4 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_138,"CHECK failed: output.get(): ");
    google::protobuf::internal::LogFinisher::operator=(local_180,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(local_138);
  }
  google::protobuf::io::Printer::Printer((Printer *)local_180,pZVar3,'$');
  this->printer_ = (Printer *)local_180;
  pFVar1 = this->file_;
  iVar2 = std::__cxx11::string::compare(*(char **)pFVar1);
  google::protobuf::io::Printer::Print
            ((char *)local_180,
             "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\n",
             (string *)0x17043b);
  if (0 < *(int *)(pFVar1 + 0x58)) {
    google::protobuf::io::Printer::Print((char *)local_180);
  }
  google::protobuf::io::Printer::Print((char *)local_180);
  if ((0 < *(int *)(pFVar1 + 0x68)) && (*(char *)(*(long *)(pFVar1 + 0x88) + 0x78) == '\x01')) {
    google::protobuf::io::Printer::Print((char *)local_180);
  }
  if (iVar2 != 0) {
    google::protobuf::io::Printer::Print((char *)local_180);
  }
  google::protobuf::io::Printer::Print((char *)local_180);
  google::protobuf::io::Printer::Print((char *)local_180);
  PrintImports(this);
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  PrintAllNestedEnumsInFile(this);
  PrintMessageDescriptors(this);
  FixForeignFieldsInDescriptors(this);
  PrintMessages(this);
  FixForeignFieldsInExtensions(this);
  FixAllDescriptorOptions(this);
  if ((0 < *(int *)(file + 0x68)) && (*(char *)(*(long *)(file + 0x88) + 0x78) == '\x01')) {
    PrintServices(this);
  }
  google::protobuf::io::Printer::Print((char *)local_180);
  google::protobuf::io::Printer::~Printer((Printer *)local_180);
  if (pZVar3 != (ZeroCopyOutputStream *)0x0) {
    (**(code **)(*(long *)pZVar3 + 8))(pZVar3);
  }
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(local_100);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  google::protobuf::internal::Mutex::Unlock();
  return (bool)(local_13f ^ 1);
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const string& parameter,
                         GeneratorContext* context,
                         string* error) const {

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  string module_name = ModuleName(file->name());
  string filename = module_name;
  StripString(&filename, ".", '/');
  filename += ".py";

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  PrintImports();
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  PrintAllNestedEnumsInFile();
  PrintMessageDescriptors();
  FixForeignFieldsInDescriptors();
  PrintMessages();
  // We have to fix up the extensions after the message classes themselves,
  // since they need to call static RegisterExtension() methods on these
  // classes.
  FixForeignFieldsInExtensions();
  // Descriptor options may have custom extensions. These custom options
  // can only be successfully parsed after we register corresponding
  // extensions. Therefore we parse all options again here to recognize
  // custom options that may be unknown when we define the descriptors.
  FixAllDescriptorOptions();
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print(
    "# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}